

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>
::val(FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>
      *this)

{
  FadExpr<FadBinaryMul<FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>
  *pFVar1;
  FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
  *pFVar2;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  pFVar1 = this->left_;
  pFVar2 = (pFVar1->fadexpr_).left_;
  pFVar3 = (pFVar2->fadexpr_).expr_.fadexpr_.left_;
  dVar4 = cos(((pFVar3->fadexpr_).left_.constant_ *
              (*(Fad<double> **)((long)&pFVar3->fadexpr_ + 0x10))->val_) /
              (pFVar2->fadexpr_).expr_.fadexpr_.right_.constant_);
  pFVar2 = (pFVar1->fadexpr_).right_;
  pFVar3 = (pFVar2->fadexpr_).expr_.fadexpr_.left_;
  dVar5 = cos(((pFVar3->fadexpr_).left_.constant_ * ((pFVar3->fadexpr_).right_)->val_) /
              (pFVar2->fadexpr_).expr_.fadexpr_.right_.constant_);
  pFVar3 = (this->right_->fadexpr_).expr_.fadexpr_.left_;
  dVar6 = sin(((pFVar3->fadexpr_).left_.constant_ * ((pFVar3->fadexpr_).right_)->val_) /
              (this->right_->fadexpr_).expr_.fadexpr_.right_.constant_);
  return dVar6 * dVar5 * dVar4;
}

Assistant:

const value_type val() const {return left_.val() * right_.val() ;}